

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

bool crnlib::rg_etc1::etc1_block::unpack_color5
               (color_quad_u8 *result,uint16 packed_color5,uint16 packed_delta3,bool scaled,
               uint alpha)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int dc_b;
  int dc_g;
  int dc_r;
  
  unpack_delta3(&dc_r,&dc_g,&dc_b,packed_delta3);
  uVar2 = (packed_color5 & 0x1f) + dc_b;
  uVar3 = (packed_color5 >> 5 & 0x1f) + dc_g;
  uVar6 = (packed_color5 >> 10 & 0x1f) + dc_r;
  uVar1 = uVar3 | uVar2 | uVar6;
  if (0x1f < uVar1) {
    if (0x1e < (int)uVar6) {
      uVar6 = 0x1f;
    }
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    if (0x1e < (int)uVar3) {
      uVar3 = 0x1f;
    }
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar4 = 0x1f;
    if ((int)uVar2 < 0x1f) {
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    if ((int)uVar4 < 1) {
      uVar2 = 0;
    }
  }
  if (scaled) {
    uVar2 = uVar2 >> 2 | uVar2 * 8;
    uVar3 = (int)uVar3 >> 2 | uVar3 * 8;
    uVar6 = uVar6 >> 2 | uVar6 * 8;
  }
  uVar5 = 0xff;
  if (alpha < 0xff) {
    uVar5 = alpha;
  }
  (result->field_0).field_0.r = (component_t)uVar6;
  (result->field_0).field_0.g = (component_t)uVar3;
  (result->field_0).field_0.b = (component_t)uVar2;
  (result->field_0).field_0.a = (component_t)uVar5;
  return uVar1 < 0x20;
}

Assistant:

bool etc1_block::unpack_color5(color_quad_u8& result, uint16 packed_color5, uint16 packed_delta3, bool scaled, uint alpha) {
  int dc_r, dc_g, dc_b;
  unpack_delta3(dc_r, dc_g, dc_b, packed_delta3);

  int b = (packed_color5 & 31U) + dc_b;
  int g = ((packed_color5 >> 5U) & 31U) + dc_g;
  int r = ((packed_color5 >> 10U) & 31U) + dc_r;

  bool success = true;
  if (static_cast<uint>(r | g | b) > 31U) {
    success = false;
    r = rg_etc1::clamp<int>(r, 0, 31);
    g = rg_etc1::clamp<int>(g, 0, 31);
    b = rg_etc1::clamp<int>(b, 0, 31);
  }

  if (scaled) {
    b = (b << 3U) | (b >> 2U);
    g = (g << 3U) | (g >> 2U);
    r = (r << 3U) | (r >> 2U);
  }

  result.set_noclamp_rgba(r, g, b, rg_etc1::minimum(alpha, 255U));
  return success;
}